

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<ParamsStream<HashWriter&,TransactionSerParams>,unsigned_char,std::allocator<unsigned_char>>
               (ParamsStream<HashWriter_&,_TransactionSerParams> *os,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *v)

{
  long lVar1;
  bool bVar2;
  size_t in_RCX;
  ParamsStream<HashWriter_&,_TransactionSerParams> *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc8;
  ParamsStream<HashWriter_&,_TransactionSerParams> *nSize;
  ParamsStream<HashWriter_&,_TransactionSerParams> *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nSize = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_ffffffffffffffc8);
  WriteCompactSize<ParamsStream<HashWriter&,TransactionSerParams>>
            (in_stack_ffffffffffffffd8,(uint64_t)nSize);
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffffd8);
  if (!bVar2) {
    SVar3 = MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffffd8);
    local_20 = (void *)SVar3.m_size;
    ParamsStream<HashWriter_&,_TransactionSerParams>::write
              (in_RDI,(int)SVar3.m_data,local_20,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}